

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSop.c
# Opt level: O3

int Abc_SopCheck(char *pSop,int nFanins)

{
  char cVar1;
  byte bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  size_t __size;
  char *pcVar7;
  
  cVar1 = *pSop;
  if (cVar1 == '\0') {
    iVar6 = 1;
  }
  else {
    bVar5 = false;
    bVar4 = false;
    pcVar7 = pSop;
    do {
      while (cVar1 != ' ') {
        cVar1 = pSop[1];
        pSop = pSop + 1;
      }
      if ((long)pSop - (long)pcVar7 != (long)nFanins) {
        fprintf(_stdout,
                "Abc_SopCheck: SOP has a mismatch between its cover size (%d) and its fanin number (%d).\n"
                ,(long)pSop - (long)pcVar7,nFanins);
        return 0;
      }
      bVar2 = pSop[1];
      bVar3 = bVar4;
      if (bVar2 < 0x6e) {
        bVar3 = true;
        if (bVar2 != 0x30) {
          if (bVar2 != 0x31) goto LAB_001ee1ad;
          bVar5 = true;
          bVar3 = bVar4;
        }
      }
      else if ((bVar2 != 0x6e) && (bVar2 != 0x78)) {
LAB_001ee1ad:
        fprintf(_stdout,
                "Abc_SopCheck: SOP has a strange character (%c) in the output part of its cube.\n",
                (ulong)(uint)(int)(char)bVar2,nFanins);
        return 0;
      }
      if (pSop[2] != '\n') {
        pcVar7 = "Abc_SopCheck: SOP has a cube without new line in the end.\n";
        __size = 0x3a;
        goto LAB_001ee19d;
      }
      cVar1 = pSop[3];
      pSop = pSop + 3;
      bVar4 = bVar3;
      pcVar7 = pSop;
    } while (cVar1 != '\0');
    iVar6 = 1;
    if (bVar5 && bVar3) {
      pcVar7 = "Abc_SopCheck: SOP has cubes in both phases.\n";
      __size = 0x2c;
LAB_001ee19d:
      fwrite(pcVar7,__size,1,_stdout);
      iVar6 = 0;
    }
  }
  return iVar6;
}

Assistant:

int Abc_SopCheck( char * pSop, int nFanins )
{
    char * pCubes, * pCubesOld;
    int fFound0 = 0, fFound1 = 0;

    // check the logic function of the node
    for ( pCubes = pSop; *pCubes; pCubes++ )
    {
        // get the end of the next cube
        for ( pCubesOld = pCubes; *pCubes != ' '; pCubes++ );
        // compare the distance
        if ( pCubes - pCubesOld != nFanins )
        {
            fprintf( stdout, "Abc_SopCheck: SOP has a mismatch between its cover size (%d) and its fanin number (%d).\n",
                (int)(ABC_PTRDIFF_T)(pCubes - pCubesOld), nFanins );
            return 0;
        }
        // check the output values for this cube
        pCubes++;
        if ( *pCubes == '0' )
            fFound0 = 1;
        else if ( *pCubes == '1' )
            fFound1 = 1;
        else if ( *pCubes != 'x' && *pCubes != 'n' )
        {
            fprintf( stdout, "Abc_SopCheck: SOP has a strange character (%c) in the output part of its cube.\n", *pCubes );
            return 0;
        }
        // check the last symbol (new line)
        pCubes++;
        if ( *pCubes != '\n' )
        {
            fprintf( stdout, "Abc_SopCheck: SOP has a cube without new line in the end.\n" );
            return 0;
        }
    }
    if ( fFound0 && fFound1 )
    {
        fprintf( stdout, "Abc_SopCheck: SOP has cubes in both phases.\n" );
        return 0;
    }
    return 1;
}